

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::ParseTableDelimiters<flatbuffers::Parser::SkipAnyJsonValue()::__0>
          (Parser *this,size_t *fieldn,StructDef *struct_def,anon_class_8_1_8991fb9c body)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  size_type_conflict sVar4;
  const_reference ppFVar5;
  size_type_conflict sVar6;
  int t;
  bool local_c2;
  allocator<char> local_c1;
  string local_c0 [38];
  byte local_9a;
  byte local_99;
  byte local_98;
  byte local_97;
  byte local_96;
  byte local_95;
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [8];
  string name;
  char local_31;
  bool is_nested_vector;
  char terminator;
  StructDef *struct_def_local;
  size_t *fieldn_local;
  Parser *this_local;
  anon_class_8_1_8991fb9c body_local;
  CheckedError *ce;
  
  local_31 = '}';
  local_c2 = false;
  body_local.this = this;
  if (body.this != (Parser *)0x0) {
    local_c2 = Is((Parser *)fieldn,0x5b);
  }
  t = (int)fieldn;
  if (local_c2 == false) {
    name.field_2._M_local_buf[0xf] = '\0';
    Expect(this,t);
    bVar2 = CheckedError::Check((CheckedError *)this);
    if (bVar2) {
      name.field_2._M_local_buf[0xf] = '\x01';
    }
    if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (bVar2) goto LAB_0012cc4e;
  }
  else {
    Next(this);
    bVar2 = CheckedError::Check((CheckedError *)this);
    if (bVar2) goto LAB_0012cc4e;
    CheckedError::~CheckedError((CheckedError *)this);
    local_31 = ']';
  }
  do {
    if ((((*(byte *)((long)fieldn + 0x3ea) & 1) == 0) ||
        (*(long *)&(struct_def->super_Definition).name == 0)) &&
       (bVar2 = Is((Parser *)fieldn,(int)local_31), bVar2)) goto LAB_0012caf8;
    std::__cxx11::string::string(local_60);
    if (local_c2 == false) {
      std::__cxx11::string::operator=(local_60,(string *)(fieldn + 5));
      bVar2 = Is((Parser *)fieldn,0x101);
      if (bVar2) {
        local_95 = 0;
        Next(this);
        cVar3 = CheckedError::Check((CheckedError *)this);
        if ((bool)cVar3) {
          local_95 = 1;
        }
        if ((local_95 & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
      }
      else {
        local_96 = 0;
        Expect(this,t);
        cVar3 = CheckedError::Check((CheckedError *)this);
        if ((bool)cVar3) {
          local_96 = 1;
        }
        if ((local_96 & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
      }
      if (!(bool)cVar3) {
        if (((fieldn[0xa9] & 1) == 0) ||
           ((bVar2 = Is((Parser *)fieldn,0x7b), !bVar2 &&
            (bVar2 = Is((Parser *)fieldn,0x5b), !bVar2)))) {
          local_97 = 0;
          Expect(this,t);
          cVar3 = CheckedError::Check((CheckedError *)this);
          if ((bool)cVar3) {
            local_97 = 1;
          }
          if ((local_97 & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((bool)cVar3) goto LAB_0012caba;
        }
LAB_0012c9c1:
        local_98 = 0;
        SkipAnyJsonValue::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)this,(string *)&this_local,(size_t *)local_60,
                   struct_def);
        cVar3 = CheckedError::Check((CheckedError *)this);
        if ((bool)cVar3) {
          local_98 = 1;
        }
        if ((local_98 & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (!(bool)cVar3) {
          bVar2 = Is((Parser *)fieldn,(int)local_31);
          if (bVar2) {
            cVar3 = '\x02';
          }
          else {
            local_99 = 0;
            ParseComma(this);
            cVar3 = CheckedError::Check((CheckedError *)this);
            if ((bool)cVar3) {
              local_99 = 1;
            }
            if ((local_99 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (!(bool)cVar3) {
              cVar3 = '\0';
            }
          }
        }
      }
    }
    else {
      uVar1 = *(ulong *)&(struct_def->super_Definition).name;
      sVar4 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::size
                        ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          *)&((body.this)->enums_).dict._M_t._M_impl.super__Rb_tree_header);
      if (uVar1 < sVar4) {
        ppFVar5 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                  operator[]((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                              *)&((body.this)->enums_).dict._M_t._M_impl.super__Rb_tree_header,
                             *(size_type_conflict *)&(struct_def->super_Definition).name);
        std::__cxx11::string::operator=(local_60,(string *)*ppFVar5);
        goto LAB_0012c9c1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,"too many unnamed fields in nested array",&local_81);
      Error(this,(string *)fieldn);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator(&local_81);
      cVar3 = '\x01';
    }
LAB_0012caba:
    std::__cxx11::string::~string(local_60);
  } while (cVar3 == '\0');
  if (cVar3 != '\x01') {
LAB_0012caf8:
    local_9a = 0;
    Next(this);
    bVar2 = CheckedError::Check((CheckedError *)this);
    if (bVar2) {
      local_9a = 1;
    }
    if ((local_9a & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (!bVar2) {
      if ((local_c2 == false) ||
         (sVar4 = *(size_type_conflict *)&(struct_def->super_Definition).name,
         sVar6 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                 size((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                      &((body.this)->enums_).dict._M_t._M_impl.super__Rb_tree_header),
         sVar4 == sVar6)) {
        anon_unknown_0::NoError();
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_c0,"wrong number of unnamed fields in table vector",&local_c1);
        Error(this,(string *)fieldn);
        std::__cxx11::string::~string(local_c0);
        std::allocator<char>::~allocator(&local_c1);
      }
    }
  }
LAB_0012cc4e:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseTableDelimiters(size_t &fieldn,
                                          const StructDef *struct_def, F body) {
  // We allow tables both as JSON object{ .. } with field names
  // or vector[..] with all fields in order
  char terminator = '}';
  bool is_nested_vector = struct_def && Is('[');
  if (is_nested_vector) {
    NEXT();
    terminator = ']';
  } else {
    EXPECT('{');
  }
  for (;;) {
    if ((!opts.strict_json || !fieldn) && Is(terminator)) break;
    std::string name;
    if (is_nested_vector) {
      if (fieldn >= struct_def->fields.vec.size()) {
        return Error("too many unnamed fields in nested array");
      }
      name = struct_def->fields.vec[fieldn]->name;
    } else {
      name = attribute_;
      if (Is(kTokenStringConstant)) {
        NEXT();
      } else {
        EXPECT(opts.strict_json ? kTokenStringConstant : kTokenIdentifier);
      }
      if (!opts.protobuf_ascii_alike || !(Is('{') || Is('['))) EXPECT(':');
    }
    ECHECK(body(name, fieldn, struct_def));
    if (Is(terminator)) break;
    ECHECK(ParseComma());
  }
  NEXT();
  if (is_nested_vector && fieldn != struct_def->fields.vec.size()) {
    return Error("wrong number of unnamed fields in table vector");
  }
  return NoError();
}